

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall BotscriptParser::parseSwitchCase(BotscriptParser *this)

{
  _Map_pointer ppSVar1;
  Lexer *pLVar2;
  _Elt_pointer pTVar3;
  _Map_pointer ppTVar4;
  _Map_pointer ppTVar5;
  _Elt_pointer pCVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  _Elt_pointer pSVar10;
  bool bVar11;
  difference_type __node_offset_1;
  difference_type __node_offset;
  long lVar12;
  CaseInfo *info;
  _Elt_pointer pCVar13;
  DataBuffer *this_00;
  _Map_pointer ppCVar14;
  _Elt_pointer pCVar15;
  int local_3c;
  int local_38;
  int local_34;
  
  local_3c = this->m_scopeCursor;
  ppSVar1 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  iVar9 = (int)((ulong)((long)(this->m_scopeStack)._deque.
                              super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                              super__Deque_impl_data._M_start._M_last -
                       (long)(this->m_scopeStack)._deque.
                             super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                             super__Deque_impl_data._M_start._M_cur) >> 3) * 0x677d46cf +
          (int)((ulong)((long)(this->m_scopeStack)._deque.
                              super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_cur -
                       (long)(this->m_scopeStack)._deque.
                             super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                             super__Deque_impl_data._M_finish._M_first) >> 3) * 0x677d46cf +
          (int)((ulong)((long)ppSVar1 -
                       (long)(this->m_scopeStack)._deque.
                             super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                             super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
          (uint)(ppSVar1 == (_Map_pointer)0x0);
  if (iVar9 <= local_3c) {
    local_34 = iVar9;
    error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:257: n (%1) is not less than size() (%2)"
                   ,&local_3c,&local_34);
  }
  pSVar10 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  lVar12 = ((long)pSVar10 -
            (long)(this->m_scopeStack)._deque.
                  super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                  super__Deque_impl_data._M_start._M_first >> 3) * 0x51b3bea3677d46cf +
           (long)local_3c;
  if (lVar12 == 0) {
    pSVar10 = pSVar10 + local_3c;
  }
  else {
    pSVar10 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
              _M_impl.super__Deque_impl_data._M_start._M_node[lVar12];
  }
  if (pSVar10->type != SCOPE_Switch) {
    error<>("case label outside switch");
  }
  bVar8 = Lexer::next(this->m_lexer,Minus);
  Lexer::mustGetNext(this->m_lexer,Number);
  pLVar2 = this->m_lexer;
  pTVar3 = (pLVar2->m_tokenPosition)._M_cur;
  ppTVar4 = (pLVar2->m_tokenPosition)._M_node;
  ppTVar5 = (pLVar2->m_tokens)._deque.
            super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  bVar11 = ppTVar4 < ppTVar5;
  if (ppTVar4 == ppTVar5) {
    bVar11 = pTVar3 < (pLVar2->m_tokens)._deque.
                      super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl
                      .super__Deque_impl_data._M_finish._M_cur;
  }
  if (bVar11) {
    ppTVar5 = (pLVar2->m_tokens)._deque.
              super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    bVar7 = ppTVar5 <= ppTVar4;
    if (ppTVar4 == ppTVar5) {
      bVar7 = (pLVar2->m_tokens)._deque.
              super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur <= pTVar3;
    }
    if (bVar7) goto LAB_001281a1;
  }
  if (bVar11) {
    ppTVar5 = (pLVar2->m_tokens)._deque.
              super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    bVar11 = ppTVar5 <= ppTVar4;
    if (ppTVar4 == ppTVar5) {
      bVar11 = (pLVar2->m_tokens)._deque.
               super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur <= pTVar3;
    }
  }
  else {
    bVar11 = false;
  }
  local_3c = CONCAT31(local_3c._1_3_,bVar11);
  local_34 = CONCAT31(local_34._1_3_,1);
  error<bool,bool>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/lexer.h:86: hasValidToken() (%1) does not equal true (%2)"
                   ,(bool *)&local_3c,(bool *)&local_34);
LAB_001281a1:
  lVar12 = String::toLong(&((pLVar2->m_tokenPosition)._M_cur)->text,(bool *)0x0,10);
  local_38 = -(int)lVar12;
  if (!bVar8) {
    local_38 = (int)lVar12;
  }
  Lexer::mustGetNext(this->m_lexer,Colon);
  local_3c = this->m_scopeCursor;
  ppSVar1 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  iVar9 = (int)((ulong)((long)(this->m_scopeStack)._deque.
                              super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                              super__Deque_impl_data._M_start._M_last -
                       (long)(this->m_scopeStack)._deque.
                             super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                             super__Deque_impl_data._M_start._M_cur) >> 3) * 0x677d46cf +
          (int)((ulong)((long)(this->m_scopeStack)._deque.
                              super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_cur -
                       (long)(this->m_scopeStack)._deque.
                             super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                             super__Deque_impl_data._M_finish._M_first) >> 3) * 0x677d46cf +
          (int)((ulong)((long)ppSVar1 -
                       (long)(this->m_scopeStack)._deque.
                             super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                             super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
          (uint)(ppSVar1 == (_Map_pointer)0x0);
  if (iVar9 <= local_3c) {
    local_34 = iVar9;
    error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:257: n (%1) is not less than size() (%2)"
                   ,&local_3c,&local_34);
  }
  pSVar10 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  lVar12 = ((long)pSVar10 -
            (long)(this->m_scopeStack)._deque.
                  super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                  super__Deque_impl_data._M_start._M_first >> 3) * 0x51b3bea3677d46cf +
           (long)local_3c;
  if (lVar12 == 0) {
    pSVar10 = pSVar10 + local_3c;
  }
  else {
    pSVar10 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
              _M_impl.super__Deque_impl_data._M_start._M_node[lVar12];
  }
  pCVar13 = (pSVar10->cases)._deque.super__Deque_base<CaseInfo,_std::allocator<CaseInfo>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  pCVar6 = (pSVar10->cases)._deque.super__Deque_base<CaseInfo,_std::allocator<CaseInfo>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pCVar13 != pCVar6) {
    pCVar15 = (pSVar10->cases)._deque.super__Deque_base<CaseInfo,_std::allocator<CaseInfo>_>._M_impl
              .super__Deque_impl_data._M_start._M_last;
    ppCVar14 = (pSVar10->cases)._deque.super__Deque_base<CaseInfo,_std::allocator<CaseInfo>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      if (pCVar13->number == local_38) {
        error<int>("multiple case %1 labels in one switch",&local_38);
      }
      pCVar13 = pCVar13 + 1;
      if (pCVar13 == pCVar15) {
        pCVar13 = ppCVar14[1];
        ppCVar14 = ppCVar14 + 1;
        pCVar15 = pCVar13 + 0x15;
      }
    } while (pCVar13 != pCVar6);
  }
  this->m_switchBuffer = (DataBuffer *)0x0;
  lVar12 = 0x18;
  if (this->m_currentMode != MainLoop) {
    lVar12 = (ulong)(this->m_currentMode == Onenter) * 8 + 8;
  }
  DataBuffer::writeHeader(*(DataBuffer **)(&this->m_isReadOnly + lVar12),CaseGoto);
  this_00 = this->m_switchBuffer;
  if (this_00 == (DataBuffer *)0x0) {
    if (this->m_currentMode == Onenter) {
      this_00 = this->m_onenterBuffer;
    }
    else if (this->m_currentMode == MainLoop) {
      this_00 = this->m_mainLoopBuffer;
    }
    else {
      this_00 = this->m_mainBuffer;
    }
  }
  DataBuffer::writeDWord(this_00,local_38);
  addSwitchCase(this,(DataBuffer *)0x0);
  iVar9 = local_38;
  local_3c = this->m_scopeCursor;
  ppSVar1 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  local_34 = (int)((ulong)((long)(this->m_scopeStack)._deque.
                                 super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                                 super__Deque_impl_data._M_start._M_last -
                          (long)(this->m_scopeStack)._deque.
                                super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                                super__Deque_impl_data._M_start._M_cur) >> 3) * 0x677d46cf +
             (int)((ulong)((long)(this->m_scopeStack)._deque.
                                 super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                                 super__Deque_impl_data._M_finish._M_cur -
                          (long)(this->m_scopeStack)._deque.
                                super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                                super__Deque_impl_data._M_finish._M_first) >> 3) * 0x677d46cf +
             (int)((ulong)((long)ppSVar1 -
                          (long)(this->m_scopeStack)._deque.
                                super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                                super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
             (uint)(ppSVar1 == (_Map_pointer)0x0);
  if (local_34 <= local_3c) {
    error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:257: n (%1) is not less than size() (%2)"
                   ,&local_3c,&local_34);
  }
  pSVar10 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  lVar12 = ((long)pSVar10 -
            (long)(this->m_scopeStack)._deque.
                  super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                  super__Deque_impl_data._M_start._M_first >> 3) * 0x51b3bea3677d46cf +
           (long)local_3c;
  if (lVar12 == 0) {
    pSVar10 = pSVar10 + local_3c;
  }
  else {
    pSVar10 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
              _M_impl.super__Deque_impl_data._M_start._M_node[lVar12];
  }
  pSVar10->casecursor->number = iVar9;
  return;
}

Assistant:

void BotscriptParser::parseSwitchCase()
{
	// case is only allowed inside switch
	if (SCOPE (0).type != SCOPE_Switch)
		error ("case label outside switch");

	// Get a literal value for the case block. Zandronum does not support
	// expressions here.
	bool isNegative = m_lexer->next(Token::Minus);
	m_lexer->mustGetNext (Token::Number);
	int num = m_lexer->token()->text.toLong();
	if (isNegative) {
		num = -num;
	}
	m_lexer->mustGetNext (Token::Colon);

	for (const CaseInfo& info : SCOPE(0).cases)
	{
		if (info.number == num)
			error ("multiple case %1 labels in one switch", num);
	}

	// Write down the expression and case-go-to. This builds
	// the case tree. The closing event will write the actual
	// blocks and move the marks appropriately.
	//
	// AddSwitchCase will add the reference to the mark
	// for the case block that this heralds, and takes care
	// of buffering setup and stuff like that.
	//
	// We null the switch buffer for the case-go-to statement as
	// we want it all under the switch, not into the case-buffers.
	m_switchBuffer = nullptr;
	currentBuffer()->writeHeader (DataHeader::CaseGoto);
	currentBuffer()->writeDWord (num);
	addSwitchCase (null);
	SCOPE (0).casecursor->number = num;
}